

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O2

Node * __thiscall wasm::DataFlow::Graph::doVisitSelect(Graph *this,Select *curr)

{
  Node *pNVar1;
  Node *value;
  Node *value_00;
  Node *pNVar2;
  
  pNVar1 = Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
                     ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,curr->ifTrue);
  value = expandFromI1(this,pNVar1,(Expression *)curr);
  pNVar1 = value;
  if (value->type != Bad) {
    pNVar1 = Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
                       ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,curr->ifFalse
                       );
    value_00 = expandFromI1(this,pNVar1,(Expression *)curr);
    pNVar1 = value_00;
    if (value_00->type != Bad) {
      pNVar1 = Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
                         ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,
                          curr->condition);
      pNVar1 = ensureI1(this,pNVar1,(Expression *)curr);
      if (pNVar1->type != Bad) {
        pNVar2 = Node::makeExpr((Expression *)curr,(Expression *)curr);
        pNVar2 = addNode(this,pNVar2);
        Node::addValue(pNVar2,pNVar1);
        Node::addValue(pNVar2,value);
        Node::addValue(pNVar2,value_00);
        pNVar1 = pNVar2;
      }
    }
  }
  return pNVar1;
}

Assistant:

Node* doVisitSelect(Select* curr) {
    auto* ifTrue = expandFromI1(visit(curr->ifTrue), curr);
    if (ifTrue->isBad()) {
      return ifTrue;
    }
    auto* ifFalse = expandFromI1(visit(curr->ifFalse), curr);
    if (ifFalse->isBad()) {
      return ifFalse;
    }
    auto* condition = ensureI1(visit(curr->condition), curr);
    if (condition->isBad()) {
      return condition;
    }
    // Great, we are supported!
    auto* ret = addNode(Node::makeExpr(curr, curr));
    ret->addValue(condition);
    ret->addValue(ifTrue);
    ret->addValue(ifFalse);
    return ret;
  }